

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReadVarint(PmaReader *p,u64 *pnOut)

{
  byte bVar1;
  int iVar2;
  uint local_44;
  int rc;
  int i;
  u8 *a;
  u8 aVarint [16];
  int iBuf;
  u64 *pnOut_local;
  PmaReader *p_local;
  
  if (p->aMap == (u8 *)0x0) {
    aVarint._12_4_ = (undefined4)(p->iReadOff % (long)p->nBuffer);
    if ((aVarint._12_4_ == 0) || (p->nBuffer - aVarint._12_4_ < 9)) {
      local_44 = 0;
      do {
        iVar2 = vdbePmaReadBlob(p,1,(u8 **)&rc);
        if (iVar2 != 0) {
          return iVar2;
        }
        aVarint[(long)(int)(local_44 & 0xf) + -8] = *_rc;
        local_44 = local_44 + 1;
      } while ((*_rc & 0x80) != 0);
      sqlite3GetVarint((uchar *)&a,pnOut);
    }
    else {
      bVar1 = sqlite3GetVarint(p->aBuffer + (int)aVarint._12_4_,pnOut);
      p->iReadOff = (ulong)bVar1 + p->iReadOff;
    }
  }
  else {
    bVar1 = sqlite3GetVarint(p->aMap + p->iReadOff,pnOut);
    p->iReadOff = (ulong)bVar1 + p->iReadOff;
  }
  return 0;
}

Assistant:

static int vdbePmaReadVarint(PmaReader *p, u64 *pnOut){
  int iBuf;

  if( p->aMap ){
    p->iReadOff += sqlite3GetVarint(&p->aMap[p->iReadOff], pnOut);
  }else{
    iBuf = p->iReadOff % p->nBuffer;
    if( iBuf && (p->nBuffer-iBuf)>=9 ){
      p->iReadOff += sqlite3GetVarint(&p->aBuffer[iBuf], pnOut);
    }else{
      u8 aVarint[16], *a;
      int i = 0, rc;
      do{
        rc = vdbePmaReadBlob(p, 1, &a);
        if( rc ) return rc;
        aVarint[(i++)&0xf] = a[0];
      }while( (a[0]&0x80)!=0 );
      sqlite3GetVarint(aVarint, pnOut);
    }
  }

  return SQLITE_OK;
}